

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O2

bool __thiscall
chaiscript::parser::
ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
::Single_Quoted_String_
          (ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
           *this)

{
  bool bVar1;
  char *pcVar2;
  eval_error *this_00;
  char cVar3;
  allocator<char> local_49;
  File_Position local_48;
  string local_40;
  
  pcVar2 = (this->m_position).m_pos;
  if ((pcVar2 == (this->m_position).m_end) || (*pcVar2 != '\'')) {
    return false;
  }
  cVar3 = '\'';
  do {
    Position::operator++(&this->m_position);
    do {
      pcVar2 = (this->m_position).m_pos;
      if (pcVar2 == (this->m_position).m_end) {
        this_00 = (eval_error *)__cxa_allocate_exception(0x90);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_40,"Unclosed single-quoted string",&local_49);
        local_48.line = (this->m_position).line;
        local_48.column = (this->m_position).col;
        exception::eval_error::eval_error
                  (this_00,&local_40,&local_48,
                   (this->m_filename).
                   super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr);
        __cxa_throw(this_00,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
      }
      if ((*pcVar2 == '\'') && (cVar3 != '\\')) {
        Position::operator++(&this->m_position);
        return true;
      }
      bVar1 = Eol_(this,false);
    } while (bVar1);
    bVar1 = cVar3 != '\\';
    cVar3 = '\0';
    if (bVar1) {
      pcVar2 = (this->m_position).m_pos;
      if (pcVar2 == (this->m_position).m_end) {
        pcVar2 = "";
      }
      cVar3 = *pcVar2;
    }
  } while( true );
}

Assistant:

constexpr bool has_more() const noexcept { return m_pos != m_end; }